

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KalmanFilter.cpp
# Opt level: O3

bool __thiscall iDynTree::DiscreteKalmanFilterHelper::kfUpdate(DiscreteKalmanFilterHelper *this)

{
  double *pdVar1;
  Scalar SVar2;
  double dVar3;
  PointerType pdVar4;
  Index index;
  ulong uVar5;
  ulong uVar6;
  PointerType pdVar7;
  long lVar8;
  PointerType pdVar9;
  PointerType pdVar10;
  long lVar11;
  ulong uVar12;
  Index index_1;
  Index index_3;
  char *pcVar13;
  Index size;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> P;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> x;
  VectorDynSize z_;
  type tmp;
  scalar_sum_op<double,_double> local_281;
  PointerType local_280;
  PointerType local_278;
  PointerType local_270;
  long local_268;
  Scalar local_260;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_258;
  PointerType pdStack_248;
  long local_240;
  long local_230;
  ulong local_228;
  long local_220;
  PointerType local_218;
  PointerType local_210;
  undefined1 local_208 [8];
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_200;
  PointerType local_1e0;
  PointerType pdStack_1d8;
  undefined1 local_1d0;
  VectorDynSize local_1c8 [32];
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
  local_1a8;
  undefined1 local_168 [32];
  variable_if_dynamic<long,__1> vStack_148;
  variable_if_dynamic<long,__1> vStack_140;
  variable_if_dynamic<long,__1> local_138;
  variable_if_dynamic<long,__1> local_130;
  variable_if_dynamic<long,__1> vStack_128;
  variable_if_dynamic<long,__1> local_120;
  variable_if_dynamic<long,__1> local_118;
  variable_if_dynamic<long,__1> local_110;
  variable_if_dynamic<long,__1> local_108;
  variable_if_dynamic<long,__1> local_100;
  variable_if_dynamic<long,__1> local_f8;
  PointerType local_f0;
  variable_if_dynamic<long,__1> vStack_e8;
  variable_if_dynamic<long,__1> local_e0;
  variable_if_dynamic<long,__1> local_d8;
  PointerType local_d0;
  variable_if_dynamic<long,__1> local_c8;
  variable_if_dynamic<long,__1> local_c0;
  variable_if_dynamic<long,__1> local_b8;
  PointerType local_b0;
  variable_if_dynamic<long,__1> local_a8;
  variable_if_dynamic<long,__1> local_a0;
  variable_if_dynamic<long,__1> local_98;
  undefined1 local_88 [16];
  variable_if_dynamic<long,__1> local_78;
  variable_if_dynamic<long,__1> local_70;
  ulong local_68;
  PointerType local_58;
  variable_if_dynamic<long,__1> vStack_50;
  variable_if_dynamic<long,__1> local_48;
  
  if (this->m_is_initialized == false) {
    pcVar13 = "filter not initialized.";
LAB_00165ead:
    iDynTree::reportError("DiscreteKalmanFilterHelper","kfUpdate",pcVar13);
    return false;
  }
  if (this->m_measurement_updated == false) {
    pcVar13 = "measurements not updated.";
    goto LAB_00165ead;
  }
  iDynTree::VectorDynSize::VectorDynSize(local_1c8);
  iDynTree::VectorDynSize::resize((ulong)local_1c8);
  uVar5 = iDynTree::VectorDynSize::data();
  uVar6 = iDynTree::VectorDynSize::size();
  pdVar7 = (PointerType)iDynTree::MatrixDynSize::data();
  lVar8 = iDynTree::MatrixDynSize::rows();
  local_270 = (PointerType)iDynTree::MatrixDynSize::cols();
  pdVar9 = (PointerType)iDynTree::VectorDynSize::data();
  local_278 = (PointerType)iDynTree::VectorDynSize::size();
  local_280 = pdVar7;
  local_268 = lVar8;
  local_1e0 = pdVar9;
  pdStack_1d8 = local_278;
  local_208 = (undefined1  [8])iDynTree::VectorDynSize::data();
  local_210 = (PointerType)iDynTree::VectorDynSize::size();
  pdVar7 = (PointerType)iDynTree::MatrixDynSize::data();
  pdVar10 = (PointerType)iDynTree::MatrixDynSize::rows();
  local_200.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value = iDynTree::MatrixDynSize::cols();
  local_200.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = pdVar7;
  local_200.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value = (long)pdVar10;
  local_218 = (PointerType)iDynTree::MatrixDynSize::data();
  lVar8 = iDynTree::MatrixDynSize::rows();
  local_230 = iDynTree::MatrixDynSize::cols();
  pdVar7 = local_280;
  local_228 = uVar6;
  local_220 = lVar8;
  if (this->m_use_feed_through == true) {
    pdVar7 = (PointerType)iDynTree::MatrixDynSize::data();
    local_278 = (PointerType)iDynTree::MatrixDynSize::rows();
    lVar8 = iDynTree::MatrixDynSize::cols();
    lVar11 = iDynTree::VectorDynSize::data();
    local_108.m_value = iDynTree::VectorDynSize::size();
    local_168._0_8_ = local_280;
    local_168._8_8_ = local_268;
    local_168._16_8_ = local_270;
    vStack_148.m_value = (long)local_1e0;
    vStack_140.m_value = (long)pdStack_1d8;
    local_138.m_value._0_1_ = local_1d0;
    vStack_128.m_value = (long)local_278;
    local_130.m_value = (long)pdVar7;
    local_120.m_value = lVar8;
    local_110.m_value = lVar11;
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>const>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_1a8,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                *)local_168);
    pdVar7 = local_280;
    uVar12 = uVar6;
    if (((uVar5 & 7) == 0) &&
       (uVar12 = (ulong)((uint)(uVar5 >> 3) & 1), (long)uVar6 <= (long)uVar12)) {
      uVar12 = uVar6;
    }
    lVar8 = uVar6 - uVar12;
    if (0 < (long)uVar12) {
      uVar14 = 0;
      do {
        *(double *)(uVar5 + uVar14 * 8) =
             *(PointerType)
              (local_1a8.
               super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
               .
               super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
               .m_d._0_8_ + uVar14 * 8);
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
    uVar14 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
    if (1 < lVar8) {
      do {
        dVar3 = ((PointerType)
                (local_1a8.
                 super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
                 .
                 super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                 .m_d._0_8_ + uVar12 * 8))[1];
        pdVar1 = (double *)(uVar5 + uVar12 * 8);
        *pdVar1 = *(PointerType)
                   (local_1a8.
                    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
                    .
                    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                    .m_d._0_8_ + uVar12 * 8);
        pdVar1[1] = dVar3;
        uVar12 = uVar12 + 2;
      } while ((long)uVar12 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar6) {
      do {
        *(double *)(uVar5 + uVar14 * 8) =
             *(PointerType)
              (local_1a8.
               super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
               .
               super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
               .m_d._0_8_ + uVar14 * 8);
        uVar14 = uVar14 + 1;
      } while (uVar6 != uVar14);
    }
    free((void *)local_1a8.
                 super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
                 .
                 super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                 .m_d._0_8_);
    goto LAB_001660bf;
  }
  local_258.m_storage.m_data = (double *)0x0;
  local_258.m_storage.m_rows = 0;
  if (local_268 == 0) {
LAB_00165fdb:
    local_260 = 1.0;
    local_168._0_8_ = pdVar7;
    local_168._8_8_ = local_268;
    local_168._16_8_ = local_270;
    local_1a8.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.
    super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
    .
    super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
    .m_argImpl.
    super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
    .
    super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
    .
    super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
    .m_data = local_278;
    local_1a8.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d._0_8_ = pdVar9;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_168,
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1a8,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_258,&local_260);
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_258,local_268,1);
    if (0 < local_258.m_storage.m_rows) {
      memset(local_258.m_storage.m_data,0,local_258.m_storage.m_rows << 3);
    }
    local_260 = 1.0;
    if (local_268 != 1) goto LAB_00165fdb;
    local_168._24_8_ = pdVar7;
    vStack_148.m_value = 1;
    local_168._0_8_ = pdVar7;
    local_168._16_8_ = local_270;
    vStack_140.m_value = (long)local_270;
    local_130.m_value = 0;
    vStack_128.m_value = 0;
    local_120.m_value = (long)local_270;
    local_110.m_value = (long)local_278;
    local_f8.m_value = (long)local_278;
    vStack_e8.m_value = 0;
    local_d8.m_value = (long)local_278;
    local_118.m_value = (long)pdVar9;
    local_100.m_value = (long)pdVar9;
    if (local_278 == (PointerType)0x0) {
      uVar15 = 0;
      uVar16 = 0;
    }
    else {
      local_1a8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.
      super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
      .
      super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.
      super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
      .
      super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
      .
      super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
      .m_data = pdVar7;
      local_1a8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.
      super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
      .
      super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
      .m_argImpl.
      super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
      .
      super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
      .
      super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
      .m_outerStride.m_value = (long)local_270;
      local_1a8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
      .
      super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
      .
      super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = (long)local_278;
      local_1a8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
      .
      super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true,_true>
      .
      super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = pdVar9;
      SVar2 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>const,1,-1,true>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const,-1,1,true>const>>,3,0>
              ::
              run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const,1,_1,true>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,_1,1,true>const>>
                        (&local_1a8,&local_281,
                         (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
                          *)local_168);
      uVar15 = SUB84(SVar2,0);
      uVar16 = (undefined4)((ulong)SVar2 >> 0x20);
    }
    *local_258.m_storage.m_data = (double)CONCAT44(uVar16,uVar15) + *local_258.m_storage.m_data;
  }
  uVar12 = uVar6;
  if (((uVar5 & 7) == 0) && (uVar12 = (ulong)((uint)(uVar5 >> 3) & 1), (long)uVar6 <= (long)uVar12))
  {
    uVar12 = uVar6;
  }
  lVar8 = uVar6 - uVar12;
  if (0 < (long)uVar12) {
    uVar14 = 0;
    do {
      *(double *)(uVar5 + uVar14 * 8) = local_258.m_storage.m_data[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
  }
  uVar14 = (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
  if (1 < lVar8) {
    do {
      dVar3 = (local_258.m_storage.m_data + uVar12)[1];
      pdVar1 = (double *)(uVar5 + uVar12 * 8);
      *pdVar1 = local_258.m_storage.m_data[uVar12];
      pdVar1[1] = dVar3;
      uVar12 = uVar12 + 2;
    } while ((long)uVar12 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar6) {
    do {
      *(double *)(uVar5 + uVar14 * 8) = local_258.m_storage.m_data[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  free(local_258.m_storage.m_data);
LAB_001660bf:
  pdVar9 = local_218;
  lVar11 = local_220;
  lVar8 = local_268;
  pdVar4 = local_270;
  local_280 = (PointerType)this->m_dim_X;
  local_168[0x10] = local_1d0;
  local_1a8.
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.
  super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
  .
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.
  super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
  .
  super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
  .
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  ._8_8_ = local_200.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
  local_240 = local_200.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value;
  local_168._0_8_ = local_1e0;
  local_168._8_8_ = pdStack_1d8;
  local_168._24_8_ =
       local_200.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_data;
  vStack_148.m_value =
       local_200.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  vStack_140.m_value =
       local_200.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  vStack_128.m_value = local_268;
  local_120.m_value = (long)local_270;
  local_108.m_value = local_268;
  local_100.m_value = (long)local_270;
  local_e0.m_value =
       local_200.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  local_f0 = local_200.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
  vStack_e8.m_value =
       local_200.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  local_c8.m_value = local_268;
  local_c0.m_value = (long)local_270;
  local_b0 = local_218;
  local_a8.m_value = local_220;
  local_a0.m_value = local_230;
  local_88._0_8_ = local_208;
  local_88._8_8_ = local_210;
  local_68 = local_228;
  local_1a8.
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d._0_8_ = local_200.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data;
  local_1a8.
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.
  super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
  .
  super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.
  super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
  .
  super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
  .
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  .m_data = (PointerType)
            local_200.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value;
  local_258.m_storage.m_rows =
       (Index)local_200.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
  pdStack_248 = (PointerType)
                local_200.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_rows.m_value;
  local_130.m_value = (long)pdVar7;
  local_110.m_value = (long)pdVar7;
  local_d0 = pdVar7;
  local_70.m_value = uVar5;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>,Eigen::Inverse<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,0>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>>,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_1e0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_Eigen::Inverse<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
              *)local_168,(assign_op<double,_double> *)&local_260,(type)0x0);
  local_168._8_8_ = local_280;
  local_168._16_8_ = local_280;
  vStack_148.m_value =
       local_1a8.
       super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
       .
       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
       .m_d._0_8_;
  vStack_140.m_value =
       (long)local_1a8.
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
             .
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_d.lhsImpl.
             super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
             .
             super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
             .m_argImpl.
             super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
             .
             super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
             .
             super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
             .m_data;
  local_138.m_value =
       local_1a8.
       super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
       .
       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
       .m_d.lhsImpl.
       super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>_>
       .
       super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_double>
       .m_argImpl.
       super_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>
       .
       super_block_evaluator<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true,_true>
       .
       super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
       ._8_8_;
  local_120.m_value = lVar8;
  local_118.m_value = (long)pdVar4;
  local_100.m_value = lVar8;
  local_f8.m_value = (long)pdVar4;
  vStack_e8.m_value = local_258.m_storage.m_rows;
  local_e0.m_value = (long)pdStack_248;
  local_d8.m_value = local_240;
  local_c0.m_value = lVar8;
  local_b8.m_value = (long)pdVar4;
  local_a8.m_value = (long)pdVar9;
  local_a0.m_value = lVar11;
  local_98.m_value = local_230;
  local_78.m_value = lVar8;
  local_70.m_value = (long)pdVar4;
  local_48.m_value =
       local_200.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  local_58 = local_200.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
  vStack_50.m_value =
       local_200.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  vStack_128.m_value = (long)pdVar7;
  local_108.m_value = (long)pdVar7;
  local_c8.m_value = (long)pdVar7;
  local_88._8_8_ = pdVar7;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>,Eigen::Inverse<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,0>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>,0>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>>,0>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,0>const>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<double,double>>
            (&local_200,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_Eigen::Inverse<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_0>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              *)local_168,(assign_op<double,_double> *)&local_260,(type)0x0);
  this->m_measurement_updated = false;
  iDynTree::VectorDynSize::~VectorDynSize(local_1c8);
  return true;
}

Assistant:

bool iDynTree::DiscreteKalmanFilterHelper::kfUpdate()
{
    if (!m_is_initialized)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfUpdate", "filter not initialized.");
        return false;
    }

    if (!m_measurement_updated)
    {
        iDynTree::reportError("DiscreteKalmanFilterHelper", "kfUpdate", "measurements not updated.");
        return false;
    }

    using iDynTree::toEigen;
    iDynTree::VectorDynSize z_;
    z_.resize(m_dim_Y);
    auto z(toEigen(z_));
    auto C(toEigen(m_C));
    auto x(toEigen(m_x));
    auto y(toEigen(m_y));
    auto P(toEigen(m_P));
    auto R(toEigen(m_R));

    if (m_use_feed_through)
    {
        auto D(toEigen(m_D));
        auto u(toEigen(m_u));
        z = (C*x) + (D*u);
    }
    else
    {
        z = C*x;
    }

    auto innovation = y - z;
    auto I =Eigen::MatrixXd::Identity(m_dim_X, m_dim_X);
    auto S = C*P*(C.transpose()) + R;
    auto K = P*(C.transpose())*(S.inverse());
    x = x + (K*innovation);
    P = (I - (K*C))*P;
    m_measurement_updated = false;
    return true;
}